

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RouterAccess.cpp
# Opt level: O0

bool __thiscall bhf::ads::RouterAccess::PciScan(RouterAccess *this,uint64_t pci_id,ostream *os)

{
  byte bVar1;
  uint32_t uVar2;
  ostream *poVar3;
  void *pvVar4;
  size_type sVar5;
  unsigned_long *puVar6;
  iterator pvVar7;
  ulong uVar8;
  bool bVar9;
  value_type *slot;
  iterator __end2;
  iterator __begin2;
  array<bhf::ads::SearchPciSlotResNew,_64UL> *__range2;
  size_type local_12b0;
  unsigned_long local_12a8;
  unsigned_long limit;
  stringstream local_1280 [8];
  stringstream stream_1;
  ostream local_1270 [376];
  string local_10f8 [48];
  stringstream local_10c8 [8];
  stringstream stream;
  ostream local_10b8 [376];
  long local_f40;
  long status;
  SearchPciBusReq req;
  uint32_t bytesRead;
  SearchPciBusResNew res;
  ostream *os_local;
  uint64_t pci_id_local;
  RouterAccess *this_local;
  
  res.slot._M_elems[0x3f]._52_8_ = os;
  memset(&req.leSubVendorID,0,0xf04);
  SearchPciBusReq::SearchPciBusReq((SearchPciBusReq *)&status,pci_id);
  local_f40 = AdsDevice::ReadWriteReqEx2
                        (&this->device,5,3,0xf04,&req.leSubVendorID,8,&status,(uint32_t *)&req);
  if (local_f40 == 0) {
    sVar5 = std::array<bhf::ads::SearchPciSlotResNew,_64UL>::size
                      ((array<bhf::ads::SearchPciSlotResNew,_64UL> *)&bytesRead);
    uVar2 = SearchPciBusResNew::nFound((SearchPciBusResNew *)&req.leSubVendorID);
    if (sVar5 < uVar2) {
      std::__cxx11::stringstream::stringstream(local_1280);
      poVar3 = std::operator<<(local_1270,"PciScan");
      poVar3 = std::operator<<(poVar3,"(): data seems corrupt. Slot count 0x");
      pvVar4 = (void *)std::ostream::operator<<(poVar3,std::hex);
      uVar2 = SearchPciBusResNew::nFound((SearchPciBusResNew *)&req.leSubVendorID);
      poVar3 = (ostream *)std::ostream::operator<<(pvVar4,uVar2);
      poVar3 = std::operator<<(poVar3," exceeds maximum 0x");
      sVar5 = std::array<bhf::ads::SearchPciSlotResNew,_64UL>::size
                        ((array<bhf::ads::SearchPciSlotResNew,_64UL> *)&bytesRead);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,sVar5);
      std::operator<<(poVar3," -> truncating\n");
      std::__cxx11::stringstream::str();
      Logger::Log(2,(string *)&limit);
      std::__cxx11::string::~string((string *)&limit);
      std::__cxx11::stringstream::~stringstream(local_1280);
    }
    local_12b0 = std::array<bhf::ads::SearchPciSlotResNew,_64UL>::size
                           ((array<bhf::ads::SearchPciSlotResNew,_64UL> *)&bytesRead);
    uVar2 = SearchPciBusResNew::nFound((SearchPciBusResNew *)&req.leSubVendorID);
    __range2 = (array<bhf::ads::SearchPciSlotResNew,_64UL> *)(ulong)uVar2;
    puVar6 = std::min<unsigned_long>(&local_12b0,(unsigned_long *)&__range2);
    local_12a8 = *puVar6;
    poVar3 = std::operator<<((ostream *)res.slot._M_elems[0x3f]._52_8_,"PCI devices found: ");
    pvVar4 = (void *)std::ostream::operator<<(poVar3,std::dec);
    poVar3 = (ostream *)std::ostream::operator<<(pvVar4,local_12a8);
    std::operator<<(poVar3,'\n');
    __end2 = std::array<bhf::ads::SearchPciSlotResNew,_64UL>::begin
                       ((array<bhf::ads::SearchPciSlotResNew,_64UL> *)&bytesRead);
    pvVar7 = std::array<bhf::ads::SearchPciSlotResNew,_64UL>::end
                       ((array<bhf::ads::SearchPciSlotResNew,_64UL> *)&bytesRead);
    while ((__end2 != pvVar7 &&
           (uVar8 = local_12a8 - 1, bVar9 = local_12a8 != 0, local_12a8 = uVar8, bVar9))) {
      poVar3 = ads::operator<<((ostream *)res.slot._M_elems[0x3f]._52_8_,__end2);
      std::operator<<(poVar3,'\n');
      __end2 = __end2 + 1;
    }
    bVar1 = std::ios::good();
    this_local._7_1_ = (bool)((bVar1 ^ 0xff) & 1);
  }
  else {
    std::__cxx11::stringstream::stringstream(local_10c8);
    poVar3 = std::operator<<(local_10b8,"PciScan");
    poVar3 = std::operator<<(poVar3,"(): failed with: 0x");
    pvVar4 = (void *)std::ostream::operator<<(poVar3,std::hex);
    poVar3 = (ostream *)std::ostream::operator<<(pvVar4,local_f40);
    std::operator<<(poVar3,'\n');
    std::__cxx11::stringstream::str();
    Logger::Log(3,local_10f8);
    std::__cxx11::string::~string((string *)local_10f8);
    std::__cxx11::stringstream::~stringstream(local_10c8);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool RouterAccess::PciScan(const uint64_t pci_id, std::ostream& os) const
{
#define ROUTERADSGRP_ACCESS_HARDWARE 0x00000005
#define ROUTERADSOFFS_A_HW_SEARCHPCIBUS 0x00000003

    SearchPciBusResNew res {};
    uint32_t bytesRead;

    const auto req = SearchPciBusReq {pci_id};
    const auto status = device.ReadWriteReqEx2(
        ROUTERADSGRP_ACCESS_HARDWARE,
        ROUTERADSOFFS_A_HW_SEARCHPCIBUS,
        sizeof(res), &res,
        sizeof(req), &req,
        &bytesRead
        );

    if (ADSERR_NOERR != status) {
        LOG_ERROR(__FUNCTION__ << "(): failed with: 0x" << std::hex << status << '\n');
        return false;
    }

    if (res.slot.size() < res.nFound()) {
        LOG_WARN(__FUNCTION__
                 << "(): data seems corrupt. Slot count 0x" << std::hex << res.nFound() << " exceeds maximum 0x" << res.slot.size() <<
                 " -> truncating\n");
    }

    auto limit = std::min<size_t>(res.slot.size(), res.nFound());
    os << "PCI devices found: " << std::dec << limit << '\n';
    for (const auto& slot: res.slot) {
        if (!limit--) {
            break;
        }
        os << slot << '\n';
    }
    return !os.good();
}